

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi_field_small.h
# Opt level: O0

bool Gudhi::persistence_fields::
     Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void>::_is_prime(uint p)

{
  ulong local_18;
  unsigned_long i;
  uint p_local;
  
  if (p < 2) {
    i._7_1_ = false;
  }
  else if (p < 4) {
    i._7_1_ = true;
  }
  else if (((p & 1) == 0) || (p % 3 == 0)) {
    i._7_1_ = false;
  }
  else {
    for (local_18 = 5; local_18 * local_18 < (ulong)p || local_18 * local_18 - (ulong)p == 0;
        local_18 = local_18 + 6) {
      if (((ulong)p % local_18 == 0) || ((ulong)p % (local_18 + 2) == 0)) {
        return false;
      }
    }
    i._7_1_ = true;
  }
  return i._7_1_;
}

Assistant:

static constexpr bool _is_prime(const unsigned int p) {
    if (p <= 1) return false;
    if (p <= 3) return true;
    if (p % 2 == 0 || p % 3 == 0) return false;

    for (unsigned long i = 5; i * i <= p; i = i + 6)
      if (p % i == 0 || p % (i + 2) == 0) return false;

    return true;
  }